

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftraster.c
# Opt level: O2

void Vertical_Sweep_Drop(black_PWorker worker,Short y,FT_F26Dot6 x1,FT_F26Dot6 x2,
                        PProfile_conflict left,PProfile_conflict right)

{
  ushort uVar1;
  long lVar2;
  ulong uVar3;
  byte bVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  
  lVar2 = (long)worker->precision;
  uVar5 = -lVar2;
  uVar7 = (x1 + lVar2) - 1U & uVar5;
  uVar6 = uVar5 & x2;
  uVar3 = uVar7;
  if ((long)uVar7 <= (long)uVar6) {
    bVar4 = (byte)worker->precision_bits;
    goto LAB_001fdc63;
  }
  if (uVar7 != uVar6 + lVar2) {
    return;
  }
  uVar1 = left->flags;
  uVar8 = uVar6;
  switch(uVar1 & 7) {
  case 0:
    break;
  case 1:
  case 5:
    if ((left->next == right) && (left->height < 1)) {
      if ((uVar1 & 0x10) == 0) {
        return;
      }
      if (x2 - x1 < (long)worker->precision_half) {
        return;
      }
    }
    if ((right->next == left) && (left->start == (long)y)) {
      if ((uVar1 & 0x20) == 0) {
        return;
      }
      if (x2 - x1 < (long)worker->precision_half) {
        return;
      }
    }
    if ((uVar1 & 7) != 1) goto switchD_001fdba4_caseD_4;
    break;
  default:
    return;
  case 4:
switchD_001fdba4_caseD_4:
    uVar8 = (long)((worker->precision * 0x3f) / 0x40) + x2 + x1 >> 1 & uVar5;
  }
  bVar4 = (byte)worker->precision_bits;
  if ((-1 < (long)uVar8) && (uVar3 = uVar8, (ulong)worker->bWidth <= uVar8 >> (bVar4 & 0x3f))) {
    uVar3 = uVar6;
  }
  if (uVar3 != uVar7) {
    uVar6 = uVar7;
  }
  uVar6 = (long)uVar6 >> (bVar4 & 0x3f);
  if (((-1 < (long)uVar6) && (uVar6 < worker->bWidth)) &&
     ((char)(worker->bLine[uVar6 >> 3] << ((byte)uVar6 & 7)) < '\0')) {
    return;
  }
LAB_001fdc63:
  uVar3 = (long)uVar3 >> (bVar4 & 0x3f);
  if ((-1 < (long)uVar3) && (uVar3 < worker->bWidth)) {
    worker->bLine[uVar3 >> 3] = worker->bLine[uVar3 >> 3] | 0x80U >> ((byte)uVar3 & 7);
  }
  return;
}

Assistant:

static void
  Vertical_Sweep_Drop( RAS_ARGS Short       y,
                                FT_F26Dot6  x1,
                                FT_F26Dot6  x2,
                                PProfile    left,
                                PProfile    right )
  {
    Long   e1, e2, pxl;
    Short  c1, f1;


    FT_TRACE7(( "  y=%d x=[% .12f;% .12f]",
                y,
                (double)x1 / (double)ras.precision,
                (double)x2 / (double)ras.precision ));

    /* Drop-out control */

    /*   e2            x2                    x1           e1   */
    /*                                                         */
    /*                 ^                     |                 */
    /*                 |                     |                 */
    /*   +-------------+---------------------+------------+    */
    /*                 |                     |                 */
    /*                 |                     v                 */
    /*                                                         */
    /* pixel         contour              contour       pixel  */
    /* center                                           center */

    /* drop-out mode    scan conversion rules (as defined in OpenType) */
    /* --------------------------------------------------------------- */
    /*  0                1, 2, 3                                       */
    /*  1                1, 2, 4                                       */
    /*  2                1, 2                                          */
    /*  3                same as mode 2                                */
    /*  4                1, 2, 5                                       */
    /*  5                1, 2, 6                                       */
    /*  6, 7             same as mode 2                                */

    e1  = CEILING( x1 );
    e2  = FLOOR  ( x2 );
    pxl = e1;

    if ( e1 > e2 )
    {
      Int  dropOutControl = left->flags & 7;


      if ( e1 == e2 + ras.precision )
      {
        switch ( dropOutControl )
        {
        case 0: /* simple drop-outs including stubs */
          pxl = e2;
          break;

        case 4: /* smart drop-outs including stubs */
          pxl = SMART( x1, x2 );
          break;

        case 1: /* simple drop-outs excluding stubs */
        case 5: /* smart drop-outs excluding stubs  */

          /* Drop-out Control Rules #4 and #6 */

          /* The specification neither provides an exact definition */
          /* of a `stub' nor gives exact rules to exclude them.     */
          /*                                                        */
          /* Here the constraints we use to recognize a stub.       */
          /*                                                        */
          /*  upper stub:                                           */
          /*                                                        */
          /*   - P_Left and P_Right are in the same contour         */
          /*   - P_Right is the successor of P_Left in that contour */
          /*   - y is the top of P_Left and P_Right                 */
          /*                                                        */
          /*  lower stub:                                           */
          /*                                                        */
          /*   - P_Left and P_Right are in the same contour         */
          /*   - P_Left is the successor of P_Right in that contour */
          /*   - y is the bottom of P_Left                          */
          /*                                                        */
          /* We draw a stub if the following constraints are met.   */
          /*                                                        */
          /*   - for an upper or lower stub, there is top or bottom */
          /*     overshoot, respectively                            */
          /*   - the covered interval is greater or equal to a half */
          /*     pixel                                              */

          /* upper stub test */
          if ( left->next == right                &&
               left->height <= 0                  &&
               !( left->flags & Overshoot_Top   &&
                  x2 - x1 >= ras.precision_half ) )
            goto Exit;

          /* lower stub test */
          if ( right->next == left                 &&
               left->start == y                    &&
               !( left->flags & Overshoot_Bottom &&
                  x2 - x1 >= ras.precision_half  ) )
            goto Exit;

          if ( dropOutControl == 1 )
            pxl = e2;
          else
            pxl = SMART( x1, x2 );
          break;

        default: /* modes 2, 3, 6, 7 */
          goto Exit;  /* no drop-out control */
        }

        /* undocumented but confirmed: If the drop-out would result in a  */
        /* pixel outside of the bounding box, use the pixel inside of the */
        /* bounding box instead                                           */
        if ( pxl < 0 )
          pxl = e1;
        else if ( TRUNC( pxl ) >= ras.bWidth )
          pxl = e2;

        /* check that the other pixel isn't set */
        e1 = ( pxl == e1 ) ? e2 : e1;

        e1 = TRUNC( e1 );

        c1 = (Short)( e1 >> 3 );
        f1 = (Short)( e1 &  7 );

        if ( e1 >= 0 && e1 < ras.bWidth     &&
             ras.bLine[c1] & ( 0x80 >> f1 ) )
          goto Exit;
      }
      else
        goto Exit;
    }

    e1 = TRUNC( pxl );

    if ( e1 >= 0 && e1 < ras.bWidth )
    {
      FT_TRACE7(( " -> x=%ld", e1 ));

      c1 = (Short)( e1 >> 3 );
      f1 = (Short)( e1 & 7 );

      ras.bLine[c1] |= (char)( 0x80 >> f1 );
    }

  Exit:
    FT_TRACE7(( " dropout=%d\n", left->flags & 7 ));
  }